

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_keyx.c
# Opt level: O2

int pkey_gost_ec_derive(EVP_PKEY_CTX *ctx,uchar *key,size_t *keylen)

{
  long lVar1;
  int iVar2;
  EVP_PKEY *pkey;
  EVP_PKEY *pkey_00;
  void *pvVar3;
  EC_KEY *pEVar4;
  EC_POINT *pEVar5;
  EC_KEY *pEVar6;
  bool bVar7;
  size_t sStack_40;
  int dgst_nid;
  
  pkey = EVP_PKEY_CTX_get0_pkey((EVP_PKEY_CTX *)ctx);
  pkey_00 = EVP_PKEY_CTX_get0_peerkey((EVP_PKEY_CTX *)ctx);
  pvVar3 = EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)ctx);
  dgst_nid = 0;
  if ((pvVar3 == (void *)0x0) || (lVar1 = *(long *)((long)pvVar3 + 0x30), lVar1 == 0)) {
    ERR_GOST_error(0x7f,0x81,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_keyx.c"
                   ,0xca);
LAB_0011baa4:
    bVar7 = false;
    goto LAB_0011baa6;
  }
  if (*(int *)((long)pvVar3 + 0x40) == 0) {
    if (lVar1 == 0x20) {
      if (key != (uchar *)0x0) {
        iVar2 = EVP_PKEY_get_id(pkey);
        pEVar4 = (EC_KEY *)EVP_PKEY_get0(pkey_00);
        pEVar5 = EC_KEY_get0_public_key(pEVar4);
        pEVar6 = (EC_KEY *)EVP_PKEY_get0(pkey);
        iVar2 = gost_keg((uchar *)((long)pvVar3 + 0x10),iVar2,(EC_POINT *)pEVar5,pEVar6,key);
        goto LAB_0011ba7f;
      }
      *keylen = 0x40;
    }
    else {
      if (lVar1 != 8) goto LAB_0011baa4;
      if (key != (uchar *)0x0) {
        EVP_PKEY_get_default_digest_nid(pkey,&dgst_nid);
        if (dgst_nid == 0x3d7) {
          dgst_nid = 0x3d6;
        }
        pEVar4 = (EC_KEY *)EVP_PKEY_get0(pkey_00);
        pEVar5 = EC_KEY_get0_public_key(pEVar4);
        pEVar6 = (EC_KEY *)EVP_PKEY_get0(pkey);
        sStack_40 = 8;
        iVar2 = dgst_nid;
        goto LAB_0011ba7a;
      }
      *keylen = 0x20;
    }
  }
  else {
    if (key != (uchar *)0x0) {
      pEVar4 = (EC_KEY *)EVP_PKEY_get0(pkey_00);
      pEVar5 = EC_KEY_get0_public_key(pEVar4);
      pEVar6 = (EC_KEY *)EVP_PKEY_get0(pkey);
      sStack_40 = *(size_t *)((long)pvVar3 + 0x30);
      iVar2 = *(int *)((long)pvVar3 + 0x40);
LAB_0011ba7a:
      iVar2 = VKO_compute_key(key,(EC_POINT *)pEVar5,pEVar6,(uchar *)((long)pvVar3 + 0x10),sStack_40
                              ,iVar2);
LAB_0011ba7f:
      *keylen = (long)iVar2;
      bVar7 = iVar2 != 0;
      goto LAB_0011baa6;
    }
    *keylen = (ulong)(*(int *)((long)pvVar3 + 0x40) != 0x3d6) * 0x20 + 0x20;
  }
  bVar7 = true;
LAB_0011baa6:
  return (int)bVar7;
}

Assistant:

int pkey_gost_ec_derive(EVP_PKEY_CTX *ctx, unsigned char *key, size_t *keylen)
{
    /*
     * Public key of peer in the ctx field peerkey
     * Our private key in the ctx pkey
     * ukm is in the algorithm specific context data
     */
    EVP_PKEY *my_key = EVP_PKEY_CTX_get0_pkey(ctx);
    EVP_PKEY *peer_key = EVP_PKEY_CTX_get0_peerkey(ctx);
    struct gost_pmeth_data *data = EVP_PKEY_CTX_get_data(ctx);
    int dgst_nid = NID_undef;

    if (!data || data->shared_ukm_size == 0) {
        GOSTerr(GOST_F_PKEY_GOST_EC_DERIVE, GOST_R_UKM_NOT_SET);
        return 0;
    }

    /* VKO */
    if (data->vko_dgst_nid) {
        if (!key) {
            *keylen = data->vko_dgst_nid == NID_id_GostR3411_2012_256? 32 : 64;
            return 1;
        }
        *keylen = VKO_compute_key(key,
                                  EC_KEY_get0_public_key(EVP_PKEY_get0(peer_key)),
                                  (EC_KEY *)EVP_PKEY_get0(my_key),
                                  data->shared_ukm, data->shared_ukm_size,
                                  data->vko_dgst_nid);
        return (*keylen) ? 1 : 0;
    }

    /*
     * shared_ukm_size = 8 stands for pre-2018 cipher suites
     * It means 32 bytes of key length, 8 byte UKM, 32-bytes hash
     *
     * shared_ukm_size = 32 stands for post-2018 cipher suites
     * It means 64 bytes of shared_key, 16 bytes of UKM and either
     * 64 bytes of hash or 64 bytes of TLSTREE output
     * */

    switch (data->shared_ukm_size) {
    case 8:
        {
            if (key == NULL) {
                *keylen = 32;
                return 1;
            }
            EVP_PKEY_get_default_digest_nid(my_key, &dgst_nid);
            if (dgst_nid == NID_id_GostR3411_2012_512)
                dgst_nid = NID_id_GostR3411_2012_256;

            *keylen =
                VKO_compute_key(key,
                                EC_KEY_get0_public_key(EVP_PKEY_get0(peer_key)),
                                (EC_KEY *)EVP_PKEY_get0(my_key),
                                data->shared_ukm, 8, dgst_nid);
            return (*keylen) ? 1 : 0;
        }
        break;
    case 32:
        {
            if (key == NULL) {
                *keylen = 64;
                return 1;
            }

            *keylen = gost_keg(data->shared_ukm, EVP_PKEY_id(my_key),
                               EC_KEY_get0_public_key(EVP_PKEY_get0(peer_key)),
                               (EC_KEY *)EVP_PKEY_get0(my_key), key);
            return (*keylen) ? 1 : 0;
        }

        break;
    default:
        return 0;
    }
}